

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O2

wchar_t archive_match_free(archive *_a)

{
  void *pvVar1;
  int iVar2;
  wchar_t wVar3;
  void *__ptr;
  
  wVar3 = L'\0';
  if (_a != (archive *)0x0) {
    iVar2 = __archive_check_magic(_a,0xcad11c9,0xffff,"archive_match_free");
    if (iVar2 == -0x1e) {
      wVar3 = L'\xffffffe2';
    }
    else {
      match_list_free((match_list *)&_a[1].error_string);
      match_list_free((match_list *)&_a[1].vtable);
      __ptr = (void *)_a[2].error_string.buffer_length;
      while (__ptr != (void *)0x0) {
        pvVar1 = *(void **)((long)__ptr + 0x18);
        archive_mstring_clean((archive_mstring *)((long)__ptr + 0x20));
        free(__ptr);
        __ptr = pvVar1;
      }
      free((void *)_a[2].read_data_offset);
      free(*(void **)&_a[2].read_data_is_posix_read);
      match_list_free((match_list *)&_a[2].read_data_requested);
      match_list_free((match_list *)&_a[3].file_count);
      free(_a);
      wVar3 = L'\0';
    }
  }
  return wVar3;
}

Assistant:

int
archive_match_free(struct archive *_a)
{
	struct archive_match *a;

	if (_a == NULL)
		return (ARCHIVE_OK);
	archive_check_magic(_a, ARCHIVE_MATCH_MAGIC,
	    ARCHIVE_STATE_ANY | ARCHIVE_STATE_FATAL, "archive_match_free");
	a = (struct archive_match *)_a;
	match_list_free(&(a->inclusions));
	match_list_free(&(a->exclusions));
	entry_list_free(&(a->exclusion_entry_list));
	free(a->inclusion_uids.ids);
	free(a->inclusion_gids.ids);
	match_list_free(&(a->inclusion_unames));
	match_list_free(&(a->inclusion_gnames));
	free(a);
	return (ARCHIVE_OK);
}